

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallprimes.c
# Opt level: O2

void init_smallprimes(void)

{
  uint __line;
  size_t i;
  long lVar1;
  ulong uVar2;
  char *__assertion;
  _Bool A [65536];
  
  if (smallprimes_array[0] == 0) {
    for (lVar1 = 2; lVar1 != 0x10000; lVar1 = lVar1 + 1) {
      A[lVar1] = true;
    }
    for (lVar1 = 2; lVar1 != 0x10000; lVar1 = lVar1 + 1) {
      if (A[lVar1] == true) {
        for (uVar2 = lVar1 * 2; uVar2 < 0x10000; uVar2 = uVar2 + lVar1) {
          A[uVar2] = false;
        }
      }
    }
    uVar2 = 0;
    for (lVar1 = 2; lVar1 != 0x10000; lVar1 = lVar1 + 1) {
      if (A[lVar1] == true) {
        if (0x198d < uVar2) {
          __assertion = "pos < NSMALLPRIMES";
          __line = 0x26;
          goto LAB_0012f1a3;
        }
        smallprimes_array[uVar2] = (unsigned_short)lVar1;
        uVar2 = uVar2 + 1;
      }
    }
    if (uVar2 != 0x198e) {
      __assertion = "pos == NSMALLPRIMES";
      __line = 0x2b;
LAB_0012f1a3:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/smallprimes.c"
                    ,__line,"void init_smallprimes(void)");
    }
  }
  return;
}

Assistant:

void init_smallprimes(void)
{
    if (smallprimes_array[0])
        return;                        /* already done */

    bool A[65536];

    for (size_t i = 2; i < lenof(A); i++)
        A[i] = true;

    for (size_t i = 2; i < lenof(A); i++) {
        if (!A[i])
            continue;
        for (size_t j = 2*i; j < lenof(A); j += i)
            A[j] = false;
    }

    size_t pos = 0;
    for (size_t i = 2; i < lenof(A); i++) {
        if (A[i]) {
            assert(pos < NSMALLPRIMES);
            smallprimes_array[pos++] = i;
        }
    }

    assert(pos == NSMALLPRIMES);
}